

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QString * __thiscall
QCommandLineParser::errorText(QString *__return_storage_ptr__,QCommandLineParser *this)

{
  QCommandLineParserPrivate *pQVar1;
  long lVar2;
  Data *pDVar3;
  QString *pQVar4;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QString local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  lVar2 = (pQVar1->errorText).d.size;
  if (lVar2 == 0) {
    lVar2 = (pQVar1->unknownOptionNames).d.size;
    if (lVar2 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_003e0faa;
    }
    if (lVar2 == 1) {
      QCoreApplication::translate
                (&local_38,"QCommandLineParser","Unknown option \'%1\'.",(char *)0x0,-1);
      pQVar4 = (this->d->unknownOptionNames).d.ptr;
      a.m_size = (pQVar4->d).size | 0x8000000000000000;
      a.field_0.m_data_utf16 = (pQVar4->d).ptr;
      QString::arg_impl(__return_storage_ptr__,&local_38,a,0,(QChar)0x20);
    }
    else {
      QCoreApplication::translate
                (&local_38,"QCommandLineParser","Unknown options: %1.",(char *)0x0,-1);
      QtPrivate::QStringList_join(&local_50,&this->d->unknownOptionNames,(QChar *)L", ",2);
      a_00.m_size = local_50.d.size | 0x8000000000000000;
      a_00.field_0.m_data_utf16 = local_50.d.ptr;
      QString::arg_impl(__return_storage_ptr__,&local_38,a_00,0,(QChar)0x20);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pDVar3 = (pQVar1->errorText).d.d;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = (pQVar1->errorText).d.ptr;
    (__return_storage_ptr__->d).size = lVar2;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_003e0faa:
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::errorText() const
{
    if (!d->errorText.isEmpty())
        return d->errorText;
    if (d->unknownOptionNames.size() == 1)
        return tr("Unknown option '%1'.").arg(d->unknownOptionNames.constFirst());
    if (d->unknownOptionNames.size() > 1)
        return tr("Unknown options: %1.").arg(d->unknownOptionNames.join(QStringLiteral(", ")));
    return QString();
}